

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O0

void __thiscall
QPixmapColorizeFilter::draw
          (QPixmapColorizeFilter *this,QPainter *painter,QPointF *dest,QPixmap *src,QRectF *srcRect)

{
  bool bVar1;
  byte bVar2;
  Format FVar3;
  int sh;
  QPixmapColorizeFilterPrivate *p;
  ulong uVar4;
  QImage *in_RDX;
  QPointF *in_RSI;
  QRectF *in_R8;
  long in_FS_OFFSET;
  double dVar5;
  undefined1 auVar6 [12];
  Format format_1;
  Format format;
  QPixmapColorizeFilterPrivate *d;
  QPainter maskPainter;
  QPainter bufPainter;
  QImage buffer;
  QPainter destPainter;
  QRect rect;
  QImage destImage;
  QImage srcImage;
  undefined4 in_stack_fffffffffffffe18;
  ImageConversionFlag in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  Format in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  QFlagsStorage<Qt::ImageConversionFlag> flags;
  undefined4 local_18c;
  undefined1 *local_188;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  QImage *in_stack_fffffffffffffe88;
  QImage *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  QFlagsStorage<Qt::ImageConversionFlag> flags_00;
  undefined8 local_158;
  int sw;
  undefined1 *local_138;
  QSize local_130;
  QImage local_128 [32];
  QImage local_108 [24];
  QPixmap local_f0 [24];
  QImage local_d8 [24];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined8 local_90;
  QImage local_88 [32];
  QImage local_68 [24];
  QImage local_50 [24];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  flags_00.i = (Int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  p = d_func((QPixmapColorizeFilter *)0x4acfcf);
  uVar4 = QPixmap::isNull();
  if ((uVar4 & 1) == 0) {
    if ((*(uint *)&p->field_0x98 & 1) == 0) {
      QPainter::drawPixmap
                ((QPainter *)in_R8,(QPointF *)p,
                 (QPixmap *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 (QRectF *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    }
    else {
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QImage::QImage((QImage *)&local_20);
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      QImage::QImage((QImage *)&local_38);
      bVar1 = QRectF::isNull(in_R8);
      flags.i = (Int)((ulong)in_R8 >> 0x20);
      if (bVar1) {
        QPixmap::toImage();
        QImage::operator=((QImage *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                          (QImage *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        QImage::~QImage(local_50);
        bVar2 = QImage::hasAlphaChannel();
        in_stack_fffffffffffffe34 = 4;
        if ((bVar2 & 1) != 0) {
          in_stack_fffffffffffffe34 = 6;
        }
        in_stack_fffffffffffffe3c = in_stack_fffffffffffffe34;
        QFlags<Qt::ImageConversionFlag>::QFlags
                  ((QFlags<Qt::ImageConversionFlag> *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   in_stack_fffffffffffffe1c);
        QImage::convertToFormat
                  ((QImage *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   in_stack_fffffffffffffe2c,(ImageConversionFlags)flags.i);
        QImage::operator=((QImage *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                          (QImage *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        QImage::~QImage(local_68);
        local_90 = QImage::size();
        FVar3 = QImage::format();
        QImage::QImage(local_88,(QSize *)&local_90,FVar3);
        QImage::operator=((QImage *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                          (QImage *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        QImage::~QImage(local_88);
      }
      else {
        local_a0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b0 = QRectF::toAlignedRect();
        local_c0 = QPixmap::rect();
        local_a0 = (undefined1  [16])
                   QRect::intersected((QRect *)CONCAT44(in_stack_fffffffffffffe24,
                                                        in_stack_fffffffffffffe20),
                                      (QRect *)CONCAT44(in_stack_fffffffffffffe1c,
                                                        in_stack_fffffffffffffe18));
        QPixmap::copy((QRect *)local_f0);
        QPixmap::toImage();
        QImage::operator=((QImage *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                          (QImage *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        QImage::~QImage(local_d8);
        QPixmap::~QPixmap(local_f0);
        bVar2 = QImage::hasAlphaChannel();
        in_stack_fffffffffffffe30 = 4;
        if ((bVar2 & 1) != 0) {
          in_stack_fffffffffffffe30 = 6;
        }
        in_stack_fffffffffffffe38 = in_stack_fffffffffffffe30;
        QFlags<Qt::ImageConversionFlag>::QFlags
                  ((QFlags<Qt::ImageConversionFlag> *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   in_stack_fffffffffffffe1c);
        QImage::convertToFormat
                  ((QImage *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   in_stack_fffffffffffffe2c,(ImageConversionFlags)flags.i);
        QImage::operator=((QImage *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                          (QImage *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        QImage::~QImage(local_108);
        local_130 = QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffe34,
                                                  in_stack_fffffffffffffe30));
        FVar3 = QImage::format();
        QImage::QImage(local_128,(QSize *)&local_130,FVar3);
        QImage::operator=((QImage *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                          (QImage *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        QImage::~QImage(local_128);
      }
      dVar5 = (double)QPixmap::devicePixelRatio();
      QImage::setDevicePixelRatio(dVar5);
      local_138 = &DAT_aaaaaaaaaaaaaaaa;
      QPainter::QPainter((QPainter *)&local_138,(QPaintDevice *)&local_38);
      sh = QImage::rect();
      grayscale(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                (QRect *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      QPainter::setCompositionMode((CompositionMode)&local_138);
      auVar6 = QImage::rect();
      sw = auVar6._8_4_;
      local_158 = auVar6._0_8_;
      QPainter::fillRect((QRect *)&local_138,(QColor *)&local_158);
      QPainter::end();
      if ((*(uint *)&p->field_0x98 >> 1 & 1) != 0) {
        flags_00.i = 0xaaaaaaaa;
        QImage::QImage((QImage *)&stack0xfffffffffffffe90,(QImage *)&local_20);
        QPainter::QPainter((QPainter *)&stack0xfffffffffffffe88,
                           (QPaintDevice *)&stack0xfffffffffffffe90);
        QPainter::setOpacity(p->strength);
        QFlags<Qt::ImageConversionFlag>::QFlags
                  ((QFlags<Qt::ImageConversionFlag> *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   in_stack_fffffffffffffe1c);
        in_stack_fffffffffffffe20 = 0xffffffff;
        QPainter::drawImage((QPainter *)
                            CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                            in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,
                            (QImage *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe84),
                            in_stack_fffffffffffffe24,-1,sw,sh,(ImageConversionFlags)flags_00.i);
        QPainter::end();
        QImage::operator=((QImage *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe84),
                          (QImage *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        QPainter::~QPainter((QPainter *)&stack0xfffffffffffffe88);
        QImage::~QImage((QImage *)&stack0xfffffffffffffe90);
      }
      uVar4 = QImage::hasAlphaChannel();
      if ((uVar4 & 1) != 0) {
        local_188 = &DAT_aaaaaaaaaaaaaaaa;
        QPainter::QPainter((QPainter *)&local_188,(QPaintDevice *)&local_38);
        QPainter::setCompositionMode((CompositionMode)&local_188);
        QFlags<Qt::ImageConversionFlag>::QFlags
                  ((QFlags<Qt::ImageConversionFlag> *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   in_stack_fffffffffffffe1c);
        QPainter::drawImage((QPainter *)
                            CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                            in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,
                            (QImage *)CONCAT44(in_stack_fffffffffffffe2c,local_18c),
                            in_stack_fffffffffffffe24,-1,sw,sh,(ImageConversionFlags)flags_00.i);
        QPainter::~QPainter((QPainter *)&local_188);
      }
      QPainter::drawImage(in_RSI,in_RDX);
      QPainter::~QPainter((QPainter *)&local_138);
      QImage::~QImage((QImage *)&local_38);
      QImage::~QImage((QImage *)&local_20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapColorizeFilter::draw(QPainter *painter, const QPointF &dest, const QPixmap &src, const QRectF &srcRect) const
{
    Q_D(const QPixmapColorizeFilter);

    if (src.isNull())
        return;

    // raster implementation

    if (!d->opaque) {
        painter->drawPixmap(dest, src, srcRect);
        return;
    }

    QImage srcImage;
    QImage destImage;

    if (srcRect.isNull()) {
        srcImage = src.toImage();
        const auto format = srcImage.hasAlphaChannel() ? QImage::Format_ARGB32_Premultiplied : QImage::Format_RGB32;
        srcImage = std::move(srcImage).convertToFormat(format);
        destImage = QImage(srcImage.size(), srcImage.format());
    } else {
        QRect rect = srcRect.toAlignedRect().intersected(src.rect());

        srcImage = src.copy(rect).toImage();
        const auto format = srcImage.hasAlphaChannel() ? QImage::Format_ARGB32_Premultiplied : QImage::Format_RGB32;
        srcImage = std::move(srcImage).convertToFormat(format);
        destImage = QImage(rect.size(), srcImage.format());
    }
    destImage.setDevicePixelRatio(src.devicePixelRatio());

    // do colorizing
    QPainter destPainter(&destImage);
    grayscale(srcImage, destImage, srcImage.rect());
    destPainter.setCompositionMode(QPainter::CompositionMode_Screen);
    destPainter.fillRect(srcImage.rect(), d->color);
    destPainter.end();

    if (d->alphaBlend) {
        // alpha blending srcImage and destImage
        QImage buffer = srcImage;
        QPainter bufPainter(&buffer);
        bufPainter.setOpacity(d->strength);
        bufPainter.drawImage(0, 0, destImage);
        bufPainter.end();
        destImage = std::move(buffer);
    }

    if (srcImage.hasAlphaChannel()) {
        Q_ASSERT(destImage.format() == QImage::Format_ARGB32_Premultiplied);
        QPainter maskPainter(&destImage);
        maskPainter.setCompositionMode(QPainter::CompositionMode_DestinationIn);
        maskPainter.drawImage(0, 0, srcImage);
    }

    painter->drawImage(dest, destImage);
}